

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O0

void rawEnumerate(FILE *outf,char *groupname,dotNode *(*results) [7],int method,int nsel,int spike,
                 int outdots,int numSkinDots,float density,char *namestring,char *rawname,
                 double scoreBias)

{
  bool bVar1;
  double dVar2;
  float local_a8;
  float local_a4;
  dotNode *local_a0;
  dotNode *node;
  double slen;
  double scaledGap;
  float scoreValue;
  float tscore;
  float tBscore;
  float tHscore;
  float tGscore;
  float score;
  float dtgp;
  float tbslen;
  float thslen;
  float tbs;
  float ths;
  float tgs;
  float bslen;
  float hslen;
  float bs;
  float hs;
  float gs;
  int doit;
  int j;
  int i;
  double scoreBias_local;
  float density_local;
  int spike_local;
  int nsel_local;
  int method_local;
  dotNode *(*results_local) [7];
  char *groupname_local;
  FILE *outf_local;
  
  if ((nsel < 1) || (numSkinDots < 1)) {
    if (method == 0) {
      fprintf((FILE *)outf,"%9.3f");
    }
    else if (spike != 0) {
      fprintf((FILE *)outf,"%9.3f",scoreBias);
    }
    if (*rawname != '\0') {
      fprintf((FILE *)outf," %s",rawname);
    }
    if ((*namestring != '\0') || (*groupname != '\0')) {
      fprintf((FILE *)outf,"%s","#");
      if (*namestring != '\0') {
        fprintf((FILE *)outf," %s",namestring);
      }
      if (*groupname != '\0') {
        fprintf((FILE *)outf," %s",groupname);
      }
    }
    fprintf((FILE *)outf,"\n");
  }
  else {
    tbslen = 0.0;
    thslen = 0.0;
    tbs = 0.0;
    scaledGap._4_4_ = 0.0;
    for (doit = 0; doit < 0x72; doit = doit + 1) {
      for (gs = 0.0; (int)gs < 7; gs = (float)((int)gs + 1)) {
        tHscore = 0.0;
        bslen = 0.0;
        hslen = 0.0;
        bs = 0.0;
        local_a0 = results[doit][(int)gs];
        bVar1 = local_a0 != (dotNode *)0x0;
        for (; local_a0 != (dotNode *)0x0; local_a0 = local_a0->next) {
          if (spike == 0) {
            bs = bs + 1.0;
          }
          else {
            if (((gs == 0.0) || (gs == 1.4013e-45)) || (gs == 2.8026e-45)) {
              bs = bs + 1.0;
              dVar2 = (double)(local_a0->gap / GAPweight);
              dVar2 = exp(-dVar2 * dVar2);
              scaledGap._0_4_ = (float)dVar2;
            }
            else if (((gs == 4.2039e-45) || (gs == 5.60519e-45)) || (gs == 7.00649e-45)) {
              bslen = bslen + 1.0;
              if (0.0 <= local_a0->gap) {
                local_a4 = local_a0->gap;
              }
              else {
                local_a4 = -local_a0->gap;
              }
              scaledGap._0_4_ = -BUMPweight * local_a4 * 0.5;
            }
            else {
              hslen = hslen + 1.0;
              if (0.0 <= local_a0->gap) {
                local_a8 = local_a0->gap;
              }
              else {
                local_a8 = -local_a0->gap;
              }
              scaledGap._0_4_ = HBweight * local_a8 * 0.5;
            }
            tHscore = scaledGap._0_4_ + tHscore;
          }
        }
        if (bVar1) {
          tbs = bs + tbs;
          thslen = hslen + thslen;
          tbslen = bslen + tbslen;
          scaledGap._4_4_ = tHscore + scaledGap._4_4_;
        }
      }
    }
    if (method == 0) {
      fprintf((FILE *)outf,"%9.3f",(double)((tbs + tbslen + thslen) / density));
    }
    else if (spike == 0) {
      fprintf((FILE *)outf,"%9.3f",scoreBias + (double)tbs);
    }
    else {
      fprintf((FILE *)outf,"%9.3f",scoreBias + (double)(scaledGap._4_4_ / density));
    }
    if (*rawname != '\0') {
      fprintf((FILE *)outf," %s",rawname);
    }
    if ((*namestring != '\0') || (*groupname != '\0')) {
      fprintf((FILE *)outf,"%s","#");
      if (*namestring != '\0') {
        fprintf((FILE *)outf," %s",namestring);
      }
      if (*groupname != '\0') {
        fprintf((FILE *)outf," %s",groupname);
      }
    }
    fprintf((FILE *)outf,"\n");
  }
  return;
}

Assistant:

void rawEnumerate(FILE *outf, char* groupname, dotNode *results[][NODEWIDTH],
               int method, int nsel, int spike, int outdots, int numSkinDots,
	       float density, char *namestring, char *rawname, double scoreBias)
{/*rawEnumerate*/
   int i, j, doit;
   float gs, hs, bs, hslen, bslen, tgs, ths, tbs, thslen, tbslen;
   float dtgp, score, tGscore, tHscore, tBscore, tscore, scoreValue;
   double scaledGap, slen;
   dotNode *node;

   /*autobondrot: countDots==1, rawOutput==1  */
   /*  *rawname holds autobondrot angle values as space_char deliniated string*/

   if (nsel <= 0 || numSkinDots <= 0) { /* empty selection */
      if (method == EXTERNALSURFACE) {
	 fprintf(outf, "%9.3f", 0.0);
      }
      else if (spike) {
	 fprintf(outf, "%9.3f", scoreBias);
      }

      if (*rawname) { fprintf(outf, " %s", rawname); }
      if (*namestring || *groupname) {
	 fprintf(outf, "%s", RAW_HEADER_COMMENT);
	 if (*namestring) { fprintf(outf, " %s", namestring); }
	 if (*groupname)  { fprintf(outf, " %s", groupname);  }
      }
      fprintf(outf, "\n");
      return;
   }

   tgs = ths = thslen = tbs = tbslen = 0.0;
   tGscore = tHscore = tBscore = tscore = 0.0;
   for (i = 0; i < NUMATOMTYPES; i++) {
   for (j = 0; j < NODEWIDTH; j++)
   {
      gs = hs = hslen = bs = bslen = score = 0.0;
      node = results[i][j];
      doit = (node != NULL);
      while(node)
      {
         if (spike)/* 04/10/2015 SJ changed the if statements in this block to reflect change in dots ordering, see NODEWIDTH in probe.h*/
         {
            // if (j == 0 || j == 1) { /* contact dot */
             if(j ==0 || j ==1 || j ==2){ /* contacts, and weak H bonds*/
                 gs += 1.0;
                 dtgp = node->gap;
                 scaledGap = dtgp/GAPweight;
                 scoreValue = exp(-scaledGap*scaledGap);
                 score   += scoreValue;
                 tGscore += scoreValue;
             }
            // else if (j == 2 || j == 3) { /* bump */
             else if(j ==3 || j ==4 || j ==5){ /* bump */
                 bs += 1.0;
                 slen = 0.5*FABS(node->gap);
                 bslen += slen;
                 scoreValue = - BUMPweight * slen;
                 score   += scoreValue;
                 tBscore += scoreValue;
             }
             else { /* H-bond */
                 hs += 1.0;
                 slen = 0.5*FABS(node->gap);
                 hslen += slen;
                 scoreValue = HBweight * slen;
                 score   += scoreValue;
                 tHscore += scoreValue;
             }
         }
         else {
             gs += 1.0;
         }
         node = node->next;
      }
      if (doit) {
         tgs += gs;
         ths += hs;
         thslen += hslen;
         tbs += bs;
         tbslen += bslen;
         tscore += score;
      }
   }
   }

   /*output one line of information */
   if (method == EXTERNALSURFACE) {
      fprintf(outf, "%9.3f", (tgs+tbs+ths)/density);
   }
   else if (spike) /*autobondrot: spike==1 at least in all examples dcr tested*/
   {
      fprintf(outf, "%9.3f", scoreBias + (tscore/density));  /*value # ...*/
   }
   else {
      fprintf(outf, "%9.3f", scoreBias + tgs);
   }
   if (*rawname) { fprintf(outf, " %s", rawname); } /*autobondrot angle values*/
   if (*namestring || *groupname) {
      fprintf(outf, "%s", RAW_HEADER_COMMENT);
      if (*namestring) { fprintf(outf, " %s", namestring); }
      if (*groupname)  { fprintf(outf, " %s", groupname);  }
   }
   fprintf(outf, "\n"); /* NOTE this is the LF for above print statements*/

   /* char* rawname == buf that is filled in autobondrot.c/runnameAndTorsion()*/
   /* contains the autobondrot angle values in the order in which processed*/

}